

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O3

_Bool binary_fuse16_populate(uint64_t *keys,uint32_t size,binary_fuse16_t *filter)

{
  ulong *puVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  uint16_t *puVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  bool bVar11;
  int iVar12;
  void *__s;
  void *__ptr;
  void *__s_00;
  void *__s_01;
  void *__ptr_00;
  long lVar13;
  ulong uVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  _Bool _Var18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  byte bVar26;
  uint uVar27;
  byte bVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint32_t h012 [5];
  size_t local_f0;
  ulong local_e8;
  uint local_c8 [4];
  uint local_b8;
  void *local_b0;
  binary_fuse16_t *local_a8;
  ulong local_a0;
  uint64_t *local_98;
  ulong local_90;
  size_t local_88;
  ulong local_80;
  void *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  undefined1 local_48 [16];
  
  if (filter->Size != size) {
    return false;
  }
  local_f0 = (size_t)size;
  uVar29 = 0x6df6b22537d23467;
  filter->Seed = 0x6df6b22537d23467;
  local_98 = keys;
  __s = calloc((ulong)(size + 1),8);
  uVar2 = filter->ArrayLength;
  uVar21 = (ulong)uVar2;
  __ptr = malloc(uVar21 * 4);
  __s_00 = calloc(uVar21,1);
  local_b0 = malloc(local_f0);
  __s_01 = calloc(uVar21,8);
  local_a0 = 0xffffffc0;
  do {
    uVar31 = 1 << ((char)local_a0 + 0x41U & 0x1f);
    local_a0 = (ulong)((int)local_a0 + 1);
  } while (uVar31 < filter->SegmentCount);
  local_90 = (ulong)uVar31;
  local_a8 = filter;
  __ptr_00 = malloc(local_90 * 4);
  auVar33._0_4_ = -(uint)((int)((ulong)__ptr >> 0x20) == 0 && (int)__ptr == 0);
  auVar33._4_4_ = -(uint)((int)__s_00 == 0 && (int)((ulong)__s_00 >> 0x20) == 0);
  auVar33._8_4_ = -(uint)((int)((ulong)local_b0 >> 0x20) == 0 && (int)local_b0 == 0);
  auVar33._12_4_ = -(uint)((int)__s_01 == 0 && (int)((ulong)__s_01 >> 0x20) == 0);
  iVar12 = movmskps((int)__ptr_00,auVar33);
  _Var18 = false;
  if (((iVar12 == 0) && (_Var18 = false, __s != (void *)0x0)) &&
     (_Var18 = false, __ptr_00 != (void *)0x0)) {
    iVar12 = (int)local_a0;
    *(undefined8 *)((long)__s + local_f0 * 8) = 1;
    local_88 = uVar21 * 8;
    lVar13 = local_90 - 1;
    auVar34._8_4_ = (int)lVar13;
    auVar34._0_8_ = lVar13;
    auVar34._12_4_ = (int)((ulong)lVar13 >> 0x20);
    uVar19 = 0x10a2a556c2d61962;
    iVar22 = 1;
    local_a0 = (ulong)(uint)-iVar12;
    local_68 = (ulong)(iVar12 + 0x40);
    local_70 = local_90 + 1 & 0xfffffffffffffffe;
    local_48 = auVar34 ^ _DAT_00107060;
    local_78 = __ptr;
    do {
      auVar33 = _DAT_00107060;
      local_80 = uVar19;
      iVar12 = (int)local_f0;
      uVar19 = local_f0 & 0xffffffff;
      uVar20 = 0;
      uVar23 = 0;
      auVar32 = _DAT_00107050;
      do {
        auVar34 = auVar32 ^ auVar33;
        if ((bool)(~(auVar34._4_4_ == local_48._4_4_ && local_48._0_4_ < auVar34._0_4_ ||
                    local_48._4_4_ < auVar34._4_4_) & 1)) {
          *(int *)((long)__ptr_00 + uVar23 * 4) = (int)(uVar20 >> ((byte)local_68 & 0x3f));
        }
        if ((auVar34._12_4_ != local_48._12_4_ || auVar34._8_4_ <= local_48._8_4_) &&
            auVar34._12_4_ <= local_48._12_4_) {
          *(int *)((long)__ptr_00 + uVar23 * 4 + 4) =
               (int)(uVar19 + uVar20 >> ((byte)local_68 & 0x3f));
        }
        uVar23 = uVar23 + 2;
        lVar13 = auVar32._8_8_;
        auVar32._0_8_ = auVar32._0_8_ + 2;
        auVar32._8_8_ = lVar13 + 2;
        uVar20 = uVar20 + uVar19 * 2;
      } while (local_70 != uVar23);
      local_e8 = 0;
      iVar16 = 0;
      if (iVar12 == 0) {
LAB_0010675f:
        if (uVar2 != 0) {
          uVar29 = 0;
          uVar20 = 0;
          do {
            *(int *)((long)__ptr + uVar20 * 4) = (int)uVar29;
            uVar17 = (uint)((*(byte *)((long)__s_00 + uVar29) & 0xfc) == 4) + (int)uVar20;
            uVar20 = (ulong)uVar17;
            uVar29 = uVar29 + 1;
          } while (uVar21 != uVar29);
          if (uVar17 == 0) {
            local_e8 = 0;
          }
          else {
            local_e8 = 0;
            do {
              uVar17 = (int)uVar20 - 1;
              uVar20 = (ulong)uVar17;
              uVar29 = (ulong)*(uint *)((long)__ptr + uVar20 * 4);
              bVar15 = *(byte *)((long)__s_00 + uVar29);
              if ((bVar15 & 0xfc) == 4) {
                uVar29 = *(ulong *)((long)__s_01 + uVar29 * 8);
                auVar8._8_8_ = 0;
                auVar8._0_8_ = uVar29;
                local_c8[3] = SUB164(ZEXT416(local_a8->SegmentCountLength) * auVar8,8);
                local_c8[1] = (uint)(uVar29 >> 0x12) & local_a8->SegmentLengthMask & 0x3ffff ^
                              local_c8[3] + local_a8->SegmentLength;
                local_c8[2] = local_a8->SegmentLengthMask & (uint)uVar29 ^
                              local_c8[3] + local_a8->SegmentLength * 2;
                local_b8 = local_c8[1];
                uVar27 = bVar15 & 3;
                uVar23 = (ulong)local_c8[(ulong)uVar27 + 1];
                bVar15 = *(byte *)((long)__s_00 + uVar23);
                bVar26 = (byte)uVar27;
                *(uint *)((long)__ptr + uVar20 * 4) = local_c8[(ulong)uVar27 + 1];
                uVar17 = uVar17 + ((bVar15 & 0xfc) == 8);
                bVar28 = bVar26 - 2;
                if (bVar26 < 2) {
                  bVar28 = bVar26 + 1;
                }
                *(byte *)((long)local_b0 + local_e8) = bVar26;
                *(ulong *)((long)__s + local_e8 * 8) = uVar29;
                puVar1 = (ulong *)((long)__s_01 + uVar23 * 8);
                *puVar1 = *puVar1 ^ uVar29;
                *(byte *)((long)__s_00 + uVar23) = bVar28 ^ bVar15 - 4;
                uVar20 = (ulong)local_c8[uVar27 + 2];
                bVar15 = *(byte *)((long)__s_00 + uVar20);
                *(uint *)((long)__ptr + (ulong)uVar17 * 4) = local_c8[uVar27 + 2];
                bVar26 = (char)(uVar27 + 2) - 3;
                if ((ulong)uVar27 == 0) {
                  bVar26 = 2;
                }
                *(byte *)((long)__s_00 + uVar20) = bVar26 ^ bVar15 - 4;
                puVar1 = (ulong *)((long)__s_01 + uVar20 * 8);
                *puVar1 = *puVar1 ^ uVar29;
                uVar20 = (ulong)(((bVar15 & 0xfc) == 8) + uVar17);
                local_e8 = (ulong)((int)local_e8 + 1);
              }
            } while ((int)uVar20 != 0);
          }
        }
        uVar17 = (uint)local_e8;
        if (uVar17 + iVar16 == iVar12) {
          _Var18 = true;
          if (uVar17 != 0) {
            uVar27 = uVar17 - 1;
            uVar3 = local_a8->SegmentLength;
            uVar2 = local_a8->SegmentLengthMask;
            puVar5 = local_a8->Fingerprints;
            uVar31 = local_a8->SegmentCountLength;
            do {
              uVar29 = *(ulong *)((long)__s + (ulong)uVar27 * 8);
              uVar21 = (ulong)*(byte *)((long)local_b0 + (ulong)uVar27);
              auVar9._8_8_ = 0;
              auVar9._0_8_ = uVar29;
              local_c8[0] = SUB164(ZEXT416(uVar31) * auVar9,8);
              local_c8[1] = (uint)(uVar29 >> 0x12) & uVar2 & 0x3ffff ^ uVar3 + local_c8[0];
              local_c8[2] = (uint)uVar29 & uVar2 ^ uVar3 * 2 + local_c8[0];
              local_c8[3] = local_c8[0];
              local_b8 = local_c8[1];
              puVar5[local_c8[uVar21]] =
                   (ushort)(uVar29 >> 0x20) ^ (ushort)uVar29 ^ puVar5[local_c8[uVar21 + 1]] ^
                   puVar5[local_c8[uVar21 + 2]];
              uVar27 = uVar27 - 1;
            } while (uVar27 < uVar17);
            _Var18 = true;
          }
          goto LAB_00106a99;
        }
        if (iVar16 != 0) {
          local_f0 = binary_fuse_sort_and_remove_dup(local_98,uVar19);
          uVar19 = local_f0 & 0xffffffff;
        }
      }
      else {
        uVar20 = 0;
        do {
          uVar23 = (local_98[uVar20] + uVar29 >> 0x21 ^ local_98[uVar20] + uVar29) *
                   -0xae502812aa7333;
          uVar23 = (uVar23 >> 0x21 ^ uVar23) * -0x3b314601e57a13ad;
          uVar23 = uVar23 >> 0x21 ^ uVar23;
          uVar24 = uVar23 >> ((byte)local_a0 & 0x3f);
          while( true ) {
            uVar17 = *(uint *)((long)__ptr_00 + uVar24 * 4);
            if (*(long *)((long)__s + (ulong)uVar17 * 8) == 0) break;
            uVar24 = (ulong)((int)uVar24 + 1U & uVar31 - 1);
          }
          *(ulong *)((long)__s + (ulong)uVar17 * 8) = uVar23;
          *(uint *)((long)__ptr_00 + uVar24 * 4) = uVar17 + 1;
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar19);
        iVar16 = 0;
        if (iVar12 == 0) goto LAB_0010675f;
        uVar17 = local_a8->SegmentLength;
        uVar27 = local_a8->SegmentLengthMask;
        local_50 = (ulong)uVar27;
        local_90 = (ulong)uVar17;
        local_58 = (ulong)uVar17 * 2;
        uVar29 = 0;
        local_60 = CONCAT44(0,local_a8->SegmentCountLength);
        bVar11 = false;
        iVar16 = 0;
        do {
          uVar20 = *(ulong *)((long)__s + uVar29 * 8);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_60;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = uVar20;
          lVar13 = SUB168(auVar6 * auVar7,8);
          *(char *)((long)__s_00 + lVar13) = *(char *)((long)__s_00 + lVar13) + '\x04';
          puVar1 = (ulong *)((long)__s_01 + lVar13 * 8);
          *puVar1 = *puVar1 ^ uVar20;
          iVar10 = SUB164(auVar6 * auVar7,8);
          uVar14 = (ulong)((uint)(uVar20 >> 0x12) & uVar27 & 0x3ffff ^ iVar10 + uVar17);
          *(byte *)((long)__s_00 + uVar14) = (*(byte *)((long)__s_00 + uVar14) ^ 1) + 4;
          puVar1 = (ulong *)((long)__s_01 + uVar14 * 8);
          *puVar1 = *puVar1 ^ uVar20;
          uVar25 = (ulong)((uint)uVar20 & uVar27 ^ (int)local_58 + iVar10);
          bVar15 = *(char *)((long)__s_00 + uVar25) + 4;
          uVar23 = *(ulong *)((long)__s_01 + uVar25 * 8);
          uVar30 = uVar23 ^ uVar20;
          *(ulong *)((long)__s_01 + uVar25 * 8) = uVar30;
          bVar26 = bVar15 ^ 2;
          *(byte *)((long)__s_00 + uVar25) = bVar26;
          uVar24 = *(ulong *)((long)__s_01 + lVar13 * 8);
          uVar4 = *(ulong *)((long)__s_01 + uVar14 * 8);
          if (((uVar30 & uVar24 & uVar4) == 0) &&
             ((((uVar24 == 0 && (*(char *)((long)__s_00 + lVar13) == '\b')) ||
               ((uVar4 == 0 && (*(char *)((long)__s_00 + uVar14) == '\b')))) ||
              ((uVar23 == uVar20 && (bVar15 == 10)))))) {
            iVar16 = iVar16 + 1;
            *(char *)((long)__s_00 + lVar13) = *(char *)((long)__s_00 + lVar13) + -4;
            *(ulong *)((long)__s_01 + lVar13 * 8) = uVar24 ^ uVar20;
            bVar15 = *(byte *)((long)__s_00 + uVar14);
            puVar1 = (ulong *)((long)__s_01 + uVar14 * 8);
            *puVar1 = *puVar1 ^ uVar20;
            *(byte *)((long)__s_00 + uVar14) = (bVar15 ^ 1) - 4;
            bVar26 = (*(byte *)((long)__s_00 + uVar25) ^ 2) - 4;
            *(byte *)((long)__s_00 + uVar25) = bVar26;
            puVar1 = (ulong *)((long)__s_01 + uVar25 * 8);
            *puVar1 = *puVar1 ^ uVar20;
          }
          if (*(byte *)((long)__s_00 + lVar13) < 4) {
            bVar11 = true;
          }
          if (*(byte *)((long)__s_00 + uVar14) < 4) {
            bVar11 = true;
          }
          if (bVar26 < 4) {
            bVar11 = true;
          }
          uVar29 = uVar29 + 1;
        } while (uVar19 != uVar29);
        __ptr = local_78;
        if (!bVar11) goto LAB_0010675f;
      }
      memset(__s,0,uVar19 << 3);
      memset(__s_00,0,uVar21);
      memset(__s_01,0,local_88);
      uVar19 = local_80 + 0x9e3779b97f4a7c15;
      uVar29 = (uVar19 >> 0x1e ^ uVar19) * -0x40a7b892e31b1a47;
      uVar29 = (uVar29 >> 0x1b ^ uVar29) * -0x6b2fb644ecceee15;
      uVar29 = uVar29 >> 0x1f ^ uVar29;
      local_a8->Seed = uVar29;
      iVar22 = iVar22 + 1;
    } while (iVar22 != 0x65);
    _Var18 = false;
  }
LAB_00106a99:
  free(__ptr);
  free(__s_00);
  free(local_b0);
  free(__s_01);
  free(__s);
  free(__ptr_00);
  return _Var18;
}

Assistant:

static inline bool binary_fuse16_populate(uint64_t *keys, uint32_t size,
                           binary_fuse16_t *filter) {
  if (size != filter->Size) {
    return false;
  }

  uint64_t rng_counter = 0x726b2b9d438b9d4d;
  filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
  uint64_t *reverseOrder = (uint64_t *)calloc((size + 1), sizeof(uint64_t));
  uint32_t capacity = filter->ArrayLength;
  uint32_t *alone = (uint32_t *)malloc(capacity * sizeof(uint32_t));
  uint8_t *t2count = (uint8_t *)calloc(capacity, sizeof(uint8_t));
  uint8_t *reverseH = (uint8_t *)malloc(size * sizeof(uint8_t));
  uint64_t *t2hash = (uint64_t *)calloc(capacity, sizeof(uint64_t));

  uint32_t blockBits = 1;
  while (((uint32_t)1 << blockBits) < filter->SegmentCount) {
    blockBits += 1;
  }
  uint32_t block = ((uint32_t)1 << blockBits);
  uint32_t *startPos = (uint32_t *)malloc((1U << blockBits) * sizeof(uint32_t));
  uint32_t h012[5];

  if ((alone == NULL) || (t2count == NULL) || (reverseH == NULL) ||
      (t2hash == NULL) || (reverseOrder == NULL) || (startPos == NULL)) {
    free(alone);
    free(t2count);
    free(reverseH);
    free(t2hash);
    free(reverseOrder);
    free(startPos);
    return false;
  }
  reverseOrder[size] = 1;
  for (int loop = 0; true; ++loop) {
    if (loop + 1 > XOR_MAX_ITERATIONS) {
      // The probability of this happening is lower than the
      // the cosmic-ray probability (i.e., a cosmic ray corrupts your system).
      free(alone);
      free(t2count);
      free(reverseH);
      free(t2hash);
      free(reverseOrder);
      free(startPos);
      return false;
    }

    for (uint32_t i = 0; i < block; i++) {
      // important : i * size would overflow as a 32-bit number in some
      // cases.
      startPos[i] = (uint32_t)(((uint64_t)i * size) >> blockBits);
    }

    uint64_t maskblock = block - 1;
    for (uint32_t i = 0; i < size; i++) {
      uint64_t hash = binary_fuse_murmur64(keys[i] + filter->Seed);
      uint64_t segment_index = hash >> (64 - blockBits);
      while (reverseOrder[startPos[segment_index]] != 0) {
        segment_index++;
        segment_index &= maskblock;
      }
      reverseOrder[startPos[segment_index]] = hash;
      startPos[segment_index]++;
    }
    int error = 0;
    uint32_t duplicates = 0;
    for (uint32_t i = 0; i < size; i++) {
      uint64_t hash = reverseOrder[i];
      uint32_t h0 = binary_fuse16_hash(0, hash, filter);
      t2count[h0] += 4;
      t2hash[h0] ^= hash;
      uint32_t h1= binary_fuse16_hash(1, hash, filter);
      t2count[h1] += 4;
      t2count[h1] ^= 1U;
      t2hash[h1] ^= hash;
      uint32_t h2 = binary_fuse16_hash(2, hash, filter);
      t2count[h2] += 4;
      t2hash[h2] ^= hash;
      t2count[h2] ^= 2U;
      if ((t2hash[h0] & t2hash[h1] & t2hash[h2]) == 0) {
        if   (((t2hash[h0] == 0) && (t2count[h0] == 8))
          ||  ((t2hash[h1] == 0) && (t2count[h1] == 8))
          ||  ((t2hash[h2] == 0) && (t2count[h2] == 8))) {
					duplicates += 1;
 					t2count[h0] -= 4;
 					t2hash[h0] ^= hash;
 					t2count[h1] -= 4;
 					t2count[h1] ^= 1U;
 					t2hash[h1] ^= hash;
 					t2count[h2] -= 4;
 					t2count[h2] ^= 2U;
 					t2hash[h2] ^= hash;
        }
      }
      error = (t2count[h0] < 4) ? 1 : error;
      error = (t2count[h1] < 4) ? 1 : error;
      error = (t2count[h2] < 4) ? 1 : error;
    }
    if(error) {
      memset(reverseOrder, 0, sizeof(uint64_t) * size);
      memset(t2count, 0, sizeof(uint8_t) * capacity);
      memset(t2hash, 0, sizeof(uint64_t) * capacity);
      filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
      continue;
    }

    // End of key addition
    uint32_t Qsize = 0;
    // Add sets with one key to the queue.
    for (uint32_t i = 0; i < capacity; i++) {
      alone[Qsize] = i;
      Qsize += ((t2count[i] >> 2U) == 1) ? 1U : 0U;
    }
    uint32_t stacksize = 0;
    while (Qsize > 0) {
      Qsize--;
      uint32_t index = alone[Qsize];
      if ((t2count[index] >> 2U) == 1) {
        uint64_t hash = t2hash[index];

        //h012[0] = binary_fuse16_hash(0, hash, filter);
        h012[1] = binary_fuse16_hash(1, hash, filter);
        h012[2] = binary_fuse16_hash(2, hash, filter);
        h012[3] = binary_fuse16_hash(0, hash, filter); // == h012[0];
        h012[4] = h012[1];
        uint8_t found = t2count[index] & 3U;
        reverseH[stacksize] = found;
        reverseOrder[stacksize] = hash;
        stacksize++;
        uint32_t other_index1 = h012[found + 1];
        alone[Qsize] = other_index1;
        Qsize += ((t2count[other_index1] >> 2U) == 2 ? 1U : 0U);

        t2count[other_index1] -= 4;
        t2count[other_index1] ^= binary_fuse_mod3(found + 1);
        t2hash[other_index1] ^= hash;

        uint32_t other_index2 = h012[found + 2];
        alone[Qsize] = other_index2;
        Qsize += ((t2count[other_index2] >> 2U) == 2 ? 1U : 0U);
        t2count[other_index2] -= 4;
        t2count[other_index2] ^= binary_fuse_mod3(found + 2);
        t2hash[other_index2] ^= hash;
      }
    }
    if (stacksize + duplicates == size) {
      // success
      size = stacksize;
      break;
    }
    if(duplicates > 0) {
      size = (uint32_t)binary_fuse_sort_and_remove_dup(keys, size);
    }
    memset(reverseOrder, 0, sizeof(uint64_t) * size);
    memset(t2count, 0, sizeof(uint8_t) * capacity);
    memset(t2hash, 0, sizeof(uint64_t) * capacity);
    filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
  }

  for (uint32_t i = size - 1; i < size; i--) {
    // the hash of the key we insert next
    uint64_t hash = reverseOrder[i];
    uint16_t xor2 = binary_fuse16_fingerprint(hash);
    uint8_t found = reverseH[i];
    h012[0] = binary_fuse16_hash(0, hash, filter);
    h012[1] = binary_fuse16_hash(1, hash, filter);
    h012[2] = binary_fuse16_hash(2, hash, filter);
    h012[3] = h012[0];
    h012[4] = h012[1];
    filter->Fingerprints[h012[found]] = (uint16_t)(
        (uint32_t)xor2 ^
        (uint32_t)filter->Fingerprints[h012[found + 1]] ^
        (uint32_t)filter->Fingerprints[h012[found + 2]]);
  }
  free(alone);
  free(t2count);
  free(reverseH);
  free(t2hash);
  free(reverseOrder);
  free(startPos);
  return true;
}